

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void luaV_concat(lua_State *L,int total)

{
  size_t __n;
  int iVar1;
  char *str;
  GCObject *pGVar2;
  uint uVar3;
  long lVar4;
  StkId pTVar5;
  TValue *p1;
  size_t sVar6;
  int iVar7;
  ulong uVar8;
  StkId pTVar9;
  
  pTVar5 = L->top;
  do {
    p1 = pTVar5 + -2;
    if (pTVar5[-2].tt_ == 3 || (pTVar5[-2].tt_ & 0xfU) == 4) {
      if ((pTVar5[-1].tt_ & 0xfU) != 4) {
        iVar1 = luaV_tostring(L,pTVar5 + -1);
        if (iVar1 == 0) goto LAB_0011229e;
      }
      sVar6 = *(size_t *)(pTVar5[-1].value_.f + 0x10);
      uVar3 = pTVar5[-2].tt_ & 0xf;
      if (sVar6 == 0) {
        iVar7 = 1;
        if (uVar3 != 4) {
          luaV_tostring(L,p1);
        }
      }
      else if ((uVar3 == 4) && (*(long *)((p1->value_).f + 0x10) == 0)) {
        pTVar5[-2].value_.f = pTVar5[-1].value_.f;
        pTVar5[-2].tt_ = pTVar5[-1].tt_;
        iVar7 = 1;
      }
      else {
        uVar8 = 1;
        if (1 < total) {
          uVar8 = 1;
          do {
            if ((p1->tt_ & 0xfU) != 4) {
              iVar1 = luaV_tostring(L,p1);
              if (iVar1 == 0) goto LAB_00112208;
            }
            if (-sVar6 - 3 <= *(ulong *)((p1->value_).f + 0x10)) {
              luaG_runerror(L,"string length overflow");
            }
            sVar6 = sVar6 + *(ulong *)((p1->value_).f + 0x10);
            uVar8 = uVar8 + 1;
            p1 = p1 + -1;
          } while ((uint)total != uVar8);
          uVar8 = (ulong)(uint)total;
        }
LAB_00112208:
        str = luaZ_openspace(L,&L->l_G->buff,sVar6);
        iVar7 = (int)uVar8;
        lVar4 = (long)iVar7 + 1;
        pTVar9 = pTVar5 + -(long)iVar7;
        sVar6 = 0;
        do {
          __n = *(size_t *)((pTVar9->value_).f + 0x10);
          memcpy(str + sVar6,(pTVar9->value_).f + 0x18,__n);
          sVar6 = __n + sVar6;
          lVar4 = lVar4 + -1;
          pTVar9 = pTVar9 + 1;
        } while (1 < lVar4);
        pGVar2 = (GCObject *)luaS_newlstr(L,str,sVar6);
        pTVar5[-(uVar8 & 0xffffffff)].value_.gc = pGVar2;
        pTVar5[-(uVar8 & 0xffffffff)].tt_ = (pGVar2->gch).tt | 0x40;
        iVar7 = iVar7 + -1;
      }
    }
    else {
LAB_0011229e:
      iVar1 = call_binTM(L,p1,pTVar5 + -1,p1,TM_CONCAT);
      iVar7 = 1;
      if (iVar1 == 0) {
        luaG_concaterror(L,p1,pTVar5 + -1);
      }
    }
    total = total - iVar7;
    pTVar5 = L->top + -(long)iVar7;
    L->top = pTVar5;
    if (total < 2) {
      return;
    }
  } while( true );
}

Assistant:

void luaV_concat (lua_State *L, int total) {
  lua_assert(total >= 2);
  do {
    StkId top = L->top;
    int n = 2;  /* number of elements handled in this pass (at least 2) */
    if (!(ttisstring(top-2) || ttisnumber(top-2)) || !tostring(L, top-1)) {
      if (!call_binTM(L, top-2, top-1, top-2, TM_CONCAT))
        luaG_concaterror(L, top-2, top-1);
    }
    else if (tsvalue(top-1)->len == 0)  /* second operand is empty? */
      (void)tostring(L, top - 2);  /* result is first operand */
    else if (ttisstring(top-2) && tsvalue(top-2)->len == 0) {
      setobjs2s(L, top - 2, top - 1);  /* result is second op. */
    }
    else {
      /* at least two non-empty string values; get as many as possible */
      size_t tl = tsvalue(top-1)->len;
      char *buffer;
      int i;
      /* collect total length */
      for (i = 1; i < total && tostring(L, top-i-1); i++) {
        size_t l = tsvalue(top-i-1)->len;
        if (l >= (MAX_SIZET/sizeof(char)) - tl)
          luaG_runerror(L, "string length overflow");
        tl += l;
      }
      buffer = luaZ_openspace(L, &G(L)->buff, tl);
      tl = 0;
      n = i;
      do {  /* concat all strings */
        size_t l = tsvalue(top-i)->len;
        memcpy(buffer+tl, svalue(top-i), l * sizeof(char));
        tl += l;
      } while (--i > 0);
      setsvalue2s(L, top-n, luaS_newlstr(L, buffer, tl));
    }
    total -= n-1;  /* got 'n' strings to create 1 new */
    L->top -= n-1;  /* popped 'n' strings and pushed one */
  } while (total > 1);  /* repeat until only 1 result left */
}